

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor
          (ZLIBBufferCompressor *this,int level)

{
  ostream *poVar1;
  CompressorException *this_00;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [392];
  int local_18;
  int local_14;
  int ret;
  int level_local;
  ZLIBBufferCompressor *this_local;
  
  local_14 = level;
  _ret = this;
  BufferCompressor::BufferCompressor(&this->super_BufferCompressor);
  (this->super_BufferCompressor)._vptr_BufferCompressor = (_func_int **)&PTR_Compress_003a3c20;
  ByteBuffer::ByteBuffer(&this->buffer_,0x2000);
  (this->stream_).zalloc = (alloc_func)0x0;
  (this->stream_).zfree = (free_func)0x0;
  (this->stream_).opaque = (voidpf)0x0;
  (this->stream_).next_in = (Bytef *)0x0;
  (this->stream_).avail_in = 0;
  local_18 = deflateInit2_(&this->stream_,local_14,8,0xfffffff1,8,0,"1.2.11",0x70);
  if (local_18 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,"problem occurred while deflating init: ZLIB_ERROR_CODE(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::operator<<(poVar1,")");
    this_00 = (CompressorException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    exceptions::CompressorException::CompressorException(this_00,&local_1d0);
    __cxa_throw(this_00,&exceptions::CompressorException::typeinfo,
                exceptions::CompressorException::~CompressorException);
  }
  return;
}

Assistant:

ZLIBBufferCompressor::ZLIBBufferCompressor(int level)
{
    /* allocate deflate state */
    stream_.zalloc = Z_NULL;
    stream_.zfree = Z_NULL;
    stream_.opaque = Z_NULL;
    stream_.next_in = Z_NULL;
    stream_.avail_in = Z_NULL;
    int ret = deflateInit2(&stream_, level, Z_DEFLATED, -MAX_WBITS, 8, Z_DEFAULT_STRATEGY);
    if (ret != Z_OK)
    {
        std::stringstream ss;
        ss << "problem occurred while deflating init: ZLIB_ERROR_CODE(" << ret << ")";
        throw CompressorException(ss.str());
    }
}